

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintgb.h
# Opt level: O0

void __thiscall
FastPForLib::VarIntGB<false>::encodeArray
          (VarIntGB<false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint *puVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  undefined4 *in_RCX;
  uint *puVar7;
  ulong in_RDX;
  byte *pbVar8;
  long in_RSI;
  ulong *in_R8;
  size_t storageinbytes;
  uint32_t val_4;
  int j;
  uint8_t *keyp_1;
  uint32_t val_3;
  uint32_t val_2;
  uint32_t val_1;
  uint32_t val;
  uint8_t *keyp;
  size_t k;
  uint8_t *initbout;
  uint8_t *bout;
  uint32_t prev;
  int local_6c;
  ulong local_48;
  uint *local_38;
  
  *in_RCX = (int)in_RDX;
  local_38 = in_RCX + 1;
  for (local_48 = 0; puVar2 = local_38, local_48 + 3 < in_RDX; local_48 = local_48 + 4) {
    puVar7 = (uint *)((long)local_38 + 1);
    *(byte *)local_38 = 0;
    uVar1 = *(uint *)(in_RSI + local_48 * 4);
    bVar3 = (byte)uVar1;
    if (uVar1 < 0x100) {
      *(byte *)puVar7 = bVar3;
      local_38 = (uint *)((long)local_38 + 2);
    }
    else {
      bVar4 = (byte)(uVar1 >> 8);
      if (uVar1 < 0x10000) {
        *(byte *)puVar7 = bVar3;
        *(byte *)((long)local_38 + 2) = bVar4;
        *(byte *)local_38 = 1;
        local_38 = (uint *)((long)local_38 + 3);
      }
      else if (uVar1 < 0x1000000) {
        *(byte *)puVar7 = bVar3;
        *(byte *)((long)local_38 + 2) = bVar4;
        *(byte *)((long)local_38 + 3) = (byte)(uVar1 >> 0x10);
        *(byte *)local_38 = 2;
        local_38 = local_38 + 1;
      }
      else {
        *puVar7 = uVar1;
        *(byte *)local_38 = 3;
        local_38 = (uint *)((long)local_38 + 5);
      }
    }
    uVar1 = *(uint *)(in_RSI + 4 + local_48 * 4);
    bVar3 = (byte)uVar1;
    if (uVar1 < 0x100) {
      *(byte *)local_38 = bVar3;
      local_38 = (uint *)((long)local_38 + 1);
    }
    else {
      bVar4 = (byte)(uVar1 >> 8);
      if (uVar1 < 0x10000) {
        pbVar8 = (byte *)((long)local_38 + 1);
        *(byte *)local_38 = bVar3;
        local_38 = (uint *)((long)local_38 + 2);
        *pbVar8 = bVar4;
        *(byte *)puVar2 = (byte)*puVar2 | 4;
      }
      else if (uVar1 < 0x1000000) {
        *(byte *)local_38 = bVar3;
        pbVar8 = (byte *)((long)local_38 + 2);
        *(byte *)((long)local_38 + 1) = bVar4;
        local_38 = (uint *)((long)local_38 + 3);
        *pbVar8 = (byte)(uVar1 >> 0x10);
        *(byte *)puVar2 = (byte)*puVar2 | 8;
      }
      else {
        *local_38 = uVar1;
        local_38 = local_38 + 1;
        *(byte *)puVar2 = (byte)*puVar2 | 0xc;
      }
    }
    uVar1 = *(uint *)(in_RSI + 8 + local_48 * 4);
    bVar3 = (byte)uVar1;
    if (uVar1 < 0x100) {
      *(byte *)local_38 = bVar3;
      local_38 = (uint *)((long)local_38 + 1);
    }
    else {
      bVar4 = (byte)(uVar1 >> 8);
      if (uVar1 < 0x10000) {
        pbVar8 = (byte *)((long)local_38 + 1);
        *(byte *)local_38 = bVar3;
        local_38 = (uint *)((long)local_38 + 2);
        *pbVar8 = bVar4;
        *(byte *)puVar2 = (byte)*puVar2 | 0x10;
      }
      else if (uVar1 < 0x1000000) {
        *(byte *)local_38 = bVar3;
        pbVar8 = (byte *)((long)local_38 + 2);
        *(byte *)((long)local_38 + 1) = bVar4;
        local_38 = (uint *)((long)local_38 + 3);
        *pbVar8 = (byte)(uVar1 >> 0x10);
        *(byte *)puVar2 = (byte)*puVar2 | 0x20;
      }
      else {
        *local_38 = uVar1;
        local_38 = local_38 + 1;
        *(byte *)puVar2 = (byte)*puVar2 | 0x30;
      }
    }
    uVar1 = *(uint *)(in_RSI + 0xc + local_48 * 4);
    bVar3 = (byte)uVar1;
    if (uVar1 < 0x100) {
      *(byte *)local_38 = bVar3;
      local_38 = (uint *)((long)local_38 + 1);
    }
    else {
      bVar4 = (byte)(uVar1 >> 8);
      if (uVar1 < 0x10000) {
        pbVar8 = (byte *)((long)local_38 + 1);
        *(byte *)local_38 = bVar3;
        local_38 = (uint *)((long)local_38 + 2);
        *pbVar8 = bVar4;
        *(byte *)puVar2 = (byte)*puVar2 | 0x40;
      }
      else if (uVar1 < 0x1000000) {
        *(byte *)local_38 = bVar3;
        pbVar8 = (byte *)((long)local_38 + 2);
        *(byte *)((long)local_38 + 1) = bVar4;
        local_38 = (uint *)((long)local_38 + 3);
        *pbVar8 = (byte)(uVar1 >> 0x10);
        *(byte *)puVar2 = (byte)*puVar2 | 0x80;
      }
      else {
        *local_38 = uVar1;
        local_38 = local_38 + 1;
        *(byte *)puVar2 = (byte)*puVar2 | 0xc0;
      }
    }
  }
  if (local_48 < in_RDX) {
    *(byte *)local_38 = 0;
    local_6c = 0;
    local_38 = (uint *)((long)local_38 + 1);
    for (; local_48 < in_RDX && local_6c < 8; local_48 = local_48 + 1) {
      uVar1 = *(uint *)(in_RSI + local_48 * 4);
      bVar3 = (byte)uVar1;
      if (uVar1 < 0x100) {
        *(byte *)local_38 = bVar3;
        local_38 = (uint *)((long)local_38 + 1);
      }
      else {
        bVar4 = (byte)(uVar1 >> 8);
        bVar6 = (byte)local_6c;
        if (uVar1 < 0x10000) {
          pbVar8 = (byte *)((long)local_38 + 1);
          *(byte *)local_38 = bVar3;
          local_38 = (uint *)((long)local_38 + 2);
          *pbVar8 = bVar4;
          *(byte *)puVar2 = (byte)*puVar2 | (byte)(1 << (bVar6 & 0x1f));
        }
        else if (uVar1 < 0x1000000) {
          *(byte *)local_38 = bVar3;
          pbVar8 = (byte *)((long)local_38 + 2);
          *(byte *)((long)local_38 + 1) = bVar4;
          local_38 = (uint *)((long)local_38 + 3);
          *pbVar8 = (byte)(uVar1 >> 0x10);
          *(byte *)puVar2 = (byte)*puVar2 | (byte)(2 << (bVar6 & 0x1f));
        }
        else {
          *local_38 = uVar1;
          local_38 = local_38 + 1;
          *(byte *)puVar2 = (byte)*puVar2 | (byte)(3 << (bVar6 & 0x1f));
        }
      }
      local_6c = local_6c + 2;
    }
  }
  while (bVar5 = needPaddingTo32Bits<unsigned_char>((uchar *)local_38), bVar5) {
    *(byte *)local_38 = 0;
    local_38 = (uint *)((long)local_38 + 1);
  }
  *in_R8 = (ulong)((long)local_38 - (long)in_RCX) >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    uint32_t prev = 0; // for delta

    uint8_t *bout = reinterpret_cast<uint8_t *>(out);
    const uint8_t *const initbout = reinterpret_cast<uint8_t *>(out);
    *out = static_cast<uint32_t>(length);
    bout += 4;

    size_t k = 0;
    for (; k + 3 < length; k += 4) {
      uint8_t *keyp = bout++;
      *keyp = 0;
      {
        const uint32_t val = delta ? in[k] - prev : in[k];
        if (delta)
          prev = in[k];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp = static_cast<uint8_t>(1);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp = static_cast<uint8_t>(2);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp = static_cast<uint8_t>(3);
        }
      }
      {
        const uint32_t val = delta ? in[k + 1] - prev : in[k + 1];
        if (delta)
          prev = in[k + 1];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 2);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 2);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 2);
        }
      }
      {
        const uint32_t val = delta ? in[k + 2] - prev : in[k + 2];
        if (delta)
          prev = in[k + 2];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 4);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 4);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 4);
        }
      }
      {
        const uint32_t val = delta ? in[k + 3] - prev : in[k + 3];
        if (delta)
          prev = in[k + 3];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 6);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 6);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 6);
        }
      }
    }

    if (k < length) {
      uint8_t *keyp = bout++;
      *keyp = 0;
      for (int j = 0; k < length && j < 8; j += 2, ++k) {
        const uint32_t val = delta ? in[k] - prev : in[k];
        if (delta)
          prev = in[k];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << j);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << j);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << j);
        }
      }
    }
    while (needPaddingTo32Bits(bout)) {
      *bout++ = 0;
    }
    const size_t storageinbytes = bout - initbout;
    assert((storageinbytes % 4) == 0);
    nvalue = storageinbytes / 4;
  }